

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_predictor_8x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  short sVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  ushort uVar19;
  byte bVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined2 uVar26;
  undefined2 uVar27;
  undefined1 auVar25 [16];
  uint uVar28;
  uint uVar32;
  uint uVar33;
  undefined1 auVar29 [16];
  uint uVar34;
  __m128i d;
  __m128i rep;
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  auVar17 = _DAT_00514d20;
  auVar16 = _DAT_00514d10;
  auVar20 = pshuflw(ZEXT116(left[7]),ZEXT116(left[7]),0);
  uVar1 = *(ulong *)above;
  bVar22 = (byte)(uVar1 >> 0x38);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = bVar22;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar3._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[10] = (char)(uVar1 >> 0x28);
  auVar6._11_4_ = auVar5._11_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = (char)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._9_6_ = auVar7._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar8._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = (char)(uVar1 >> 0x10);
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = (char)(uVar1 >> 8);
  uVar19 = CONCAT11(0,(byte)uVar1);
  auVar9._2_13_ = auVar13;
  auVar9._0_2_ = uVar19;
  uVar27 = auVar20._2_2_;
  auVar25._0_12_ = auVar9._0_12_;
  auVar25._12_2_ = (short)Var11;
  auVar25._14_2_ = uVar27;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar9._0_10_;
  uVar26 = auVar20._0_2_;
  auVar24._10_2_ = uVar26;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._8_2_ = auVar12._0_2_;
  auVar23._6_2_ = uVar27;
  auVar23._4_2_ = auVar13._0_2_;
  auVar23._2_2_ = uVar26;
  auVar23._0_2_ = uVar19;
  auVar21._2_2_ = uVar26;
  auVar21._0_2_ = auVar8._8_2_;
  auVar21._4_2_ = auVar6._10_2_;
  auVar21._6_2_ = uVar27;
  auVar21._8_2_ = auVar4._12_2_;
  auVar21._10_2_ = uVar26;
  auVar21[0xc] = bVar22;
  auVar21[0xd] = 0;
  auVar21._14_2_ = uVar27;
  auVar25 = pshuflw(ZEXT116(bVar22),ZEXT116(bVar22),0);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)left;
  iVar18 = 8;
  auVar20 = _DAT_00514c10;
  auVar24 = _DAT_004d9da0;
  do {
    auVar41 = pshufb(_DAT_00514c80,auVar20);
    auVar46 = pshufb(_DAT_00514c90,auVar20);
    auVar45._0_12_ = auVar41._0_12_;
    auVar45._12_2_ = auVar41._6_2_;
    auVar45._14_2_ = auVar46._6_2_;
    auVar44._12_4_ = auVar45._12_4_;
    auVar44._0_10_ = auVar41._0_10_;
    auVar44._10_2_ = auVar46._4_2_;
    auVar43._10_6_ = auVar44._10_6_;
    auVar43._0_8_ = auVar41._0_8_;
    auVar43._8_2_ = auVar41._4_2_;
    auVar42._8_8_ = auVar43._8_8_;
    auVar42._6_2_ = auVar46._2_2_;
    auVar42._4_2_ = auVar41._2_2_;
    auVar42._0_2_ = auVar41._0_2_;
    auVar42._2_2_ = auVar46._0_2_;
    auVar47 = pmaddwd(auVar23,auVar42);
    auVar41 = pshufb(auVar35,auVar24);
    auVar31._0_12_ = auVar41._0_12_;
    auVar31._12_2_ = auVar41._6_2_;
    auVar31._14_2_ = auVar25._2_2_;
    auVar30._12_4_ = auVar31._12_4_;
    auVar30._0_10_ = auVar41._0_10_;
    auVar30._10_2_ = auVar25._0_2_;
    auVar46._10_6_ = auVar30._10_6_;
    auVar46._0_8_ = auVar41._0_8_;
    auVar46._8_2_ = auVar41._4_2_;
    auVar29._8_8_ = auVar46._8_8_;
    auVar29._6_2_ = auVar25._2_2_;
    auVar29._4_2_ = auVar41._2_2_;
    auVar29._0_2_ = auVar41._0_2_;
    auVar29._2_2_ = auVar25._0_2_;
    auVar41 = pmaddwd(auVar29,auVar16);
    uVar36 = auVar41._0_4_ + 0x100 + auVar47._0_4_;
    uVar38 = auVar41._4_4_ + 0x100 + auVar47._4_4_;
    uVar39 = auVar41._8_4_ + 0x100 + auVar47._8_4_;
    uVar40 = auVar41._12_4_ + 0x100 + auVar47._12_4_;
    auVar46 = pmaddwd(auVar42,auVar21);
    auVar41 = pmaddwd(auVar29,auVar17);
    uVar28 = auVar41._0_4_ + 0x100 + auVar46._0_4_;
    uVar32 = auVar41._4_4_ + 0x100 + auVar46._4_4_;
    uVar33 = auVar41._8_4_ + 0x100 + auVar46._8_4_;
    uVar34 = auVar41._12_4_ + 0x100 + auVar46._12_4_;
    sVar2 = (short)(uVar36 >> 9);
    uVar19 = (ushort)(uVar36 >> 0x19);
    auVar37[1] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar36 >> 0x19) - (0xff < uVar19);
    auVar37[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar36 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar38 >> 9);
    auVar37[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar38 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar38 >> 0x19);
    auVar37[3] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar38 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar39 >> 9);
    auVar37[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar39 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar39 >> 0x19);
    auVar37[5] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar39 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar40 >> 9);
    auVar37[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar40 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar40 >> 0x19);
    auVar37[7] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar40 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar28 >> 9);
    auVar37[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar28 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar28 >> 0x19);
    auVar37[9] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar28 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar32 >> 9);
    auVar37[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar32 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar32 >> 0x19);
    auVar37[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar32 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar33 >> 9);
    auVar37[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar33 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar33 >> 0x19);
    auVar37[0xd] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar33 >> 0x19) - (0xff < uVar19);
    sVar2 = (short)(uVar34 >> 9);
    auVar37[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar34 >> 9) - (0xff < sVar2);
    uVar19 = (ushort)(uVar34 >> 0x19);
    auVar37[0xf] = (uVar19 != 0) * (uVar19 < 0x100) * (byte)(uVar34 >> 0x19) - (0xff < uVar19);
    auVar41 = pshufb(auVar37,ZEXT816(0xe0c0a0806040200));
    *(long *)dst = auVar41._0_8_;
    dst = dst + stride;
    auVar47._0_2_ = auVar24._0_2_ + 1;
    auVar47._2_2_ = auVar24._2_2_ + 1;
    auVar47._4_2_ = auVar24._4_2_ + 1;
    auVar47._6_2_ = auVar24._6_2_ + 1;
    auVar47._8_2_ = auVar24._8_2_ + 1;
    auVar47._10_2_ = auVar24._10_2_ + 1;
    auVar47._12_2_ = auVar24._12_2_ + 1;
    auVar47._14_2_ = auVar24._14_2_ + 1;
    auVar41._0_2_ = auVar20._0_2_ + 0x202;
    auVar41._2_2_ = auVar20._2_2_ + 0x202;
    auVar41._4_2_ = auVar20._4_2_ + 0x202;
    auVar41._6_2_ = auVar20._6_2_ + 0x202;
    auVar41._8_2_ = auVar20._8_2_ + 0x202;
    auVar41._10_2_ = auVar20._10_2_ + 0x202;
    auVar41._12_2_ = auVar20._12_2_ + 0x202;
    auVar41._14_2_ = auVar20._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar20 = auVar41;
    auVar24 = auVar47;
  } while (iVar18 != 0);
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}